

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O1

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  byte bVar1;
  MajorMode_t MVar2;
  CommandOptions *__s1;
  int iVar3;
  ChannelFormat_t CVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  char *pcVar10;
  CommandOptions *this_00;
  uint uVar11;
  int iVar12;
  ui32_t length;
  allocator<char> local_71;
  byte_t *local_70;
  byte_t *local_68;
  byte_t *local_60;
  ui32_t *local_58;
  undefined1 local_50 [32];
  
  this->mode = MMT_NONE;
  this->error_flag = true;
  this->key_flag = false;
  this->key_id_flag = false;
  this->asset_id_flag = false;
  this->encrypt_header_flag = true;
  this->write_hmac = true;
  this->read_hmac = false;
  this->split_wav = false;
  this->mono_wav = false;
  this->verbose_flag = false;
  this->fb_dump_size = 0;
  this->showindex_flag = false;
  this->showheader_flag = false;
  this->no_write_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->stereo_image_flag = false;
  this->number_width = 6;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->duration_flag = false;
  this->do_repeat = false;
  this->use_smpte_labels = false;
  this->j2c_pedantic = true;
  this->picture_rate = 0x18;
  this->fb_size = 0x400000;
  this->channel_fmt = CF_NONE;
  *(undefined8 *)&this->file_count = 0;
  *(undefined8 *)((long)&this->file_root + 4) = 0;
  *(undefined8 *)((long)&this->out_file + 4) = 0;
  this->key_value[4] = '\0';
  this->key_value[5] = '\0';
  this->key_value[6] = '\0';
  this->key_value[7] = '\0';
  this->key_value[8] = '\0';
  this->key_value[9] = '\0';
  this->key_value[10] = '\0';
  this->key_value[0xb] = '\0';
  *(undefined8 *)(this->key_value + 0xc) = 0;
  this->key_id_value[4] = '\0';
  this->key_id_value[5] = '\0';
  this->key_id_value[6] = '\0';
  this->key_id_value[7] = '\0';
  this->key_id_value[8] = '\0';
  this->key_id_value[9] = '\0';
  this->key_id_value[10] = '\0';
  this->key_id_value[0xb] = '\0';
  this->key_id_value[0xc] = '\0';
  this->key_id_value[0xd] = '\0';
  this->key_id_value[0xe] = '\0';
  this->key_id_value[0xf] = '\0';
  bVar9 = 1 < argc;
  this_00 = this;
  if (1 < argc) {
    local_58 = &this->fb_dump_size;
    local_60 = this->key_value;
    local_68 = this->key_id_value;
    local_70 = this->asset_id_value;
    iVar12 = 1;
    do {
      __s1 = (CommandOptions *)argv[iVar12];
      this_00 = __s1;
      iVar3 = strcmp((char *)__s1,"-help");
      if (iVar3 == 0) {
        this->help_flag = true;
        goto LAB_00112f91;
      }
      if ((char)__s1->mode != 0x2d) {
        uVar11 = this->file_count;
        uVar6 = uVar11 + 1;
        this->file_count = uVar6;
        this->filenames[uVar11] = (char *)__s1;
        if (0xf < uVar6) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        goto LAB_00112f91;
      }
      bVar1 = *(byte *)((long)&__s1->mode + 1);
      uVar11 = (uint)(char)bVar1;
      this_00 = (CommandOptions *)(ulong)uVar11;
      iVar3 = isalpha(uVar11);
      if ((9 < uVar11 - 0x30 && iVar3 == 0) || (*(byte *)((long)&__s1->mode + 2) != 0)) {
        this_00 = _stderr;
        fprintf((FILE *)_stderr,"Unrecognized argument: %s\n",__s1);
        goto LAB_001134e0;
      }
      switch(bVar1) {
      case 0x31:
        this->mono_wav = true;
        break;
      case 0x32:
      case 0x53:
        this->split_wav = true;
        break;
      case 0x33:
        this->stereo_image_flag = true;
        break;
      default:
        this_00 = _stderr;
        fprintf((FILE *)_stderr,"Unrecognized option: %s\n",__s1);
        goto LAB_001134e0;
      case 0x45:
        this->encrypt_header_flag = false;
        break;
      case 0x47:
        this->mode = MMT_GOP_START;
        break;
      case 0x48:
        this->showheader_flag = true;
        break;
      case 0x4c:
        this->use_smpte_labels = true;
        break;
      case 0x4d:
        this->write_hmac = false;
        break;
      case 0x52:
        this->do_repeat = true;
        break;
      case 0x55:
        this->mode = MMT_UL_LIST;
        break;
      case 0x56:
        this->version_flag = true;
        break;
      case 0x57:
        this->no_write_flag = true;
        break;
      case 0x5a:
        this->j2c_pedantic = false;
        break;
      case 0x61:
        this->asset_id_flag = true;
        iVar12 = iVar12 + 1;
        if ((iVar12 < argc) &&
           (this_00 = (CommandOptions *)argv[iVar12], (char)this_00->mode != 0x2d)) {
          Kumu::hex2bin((char *)this_00,local_70,0x10,(uint *)local_50);
          uVar8 = (ulong)(uint)local_50._0_4_;
          if (local_50._0_4_ == 0x10) break;
          pcVar10 = "Unexpected asset ID length: %u, expecting %u characters.\n";
LAB_001135e2:
          this_00 = _stderr;
          fprintf((FILE *)_stderr,pcVar10,uVar8,0x10);
        }
        else {
          CommandOptions(this_00);
        }
LAB_001134e0:
        if (bVar9) {
          return;
        }
        goto LAB_001134e8;
      case 0x62:
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) ||
           (this_00 = (CommandOptions *)argv[iVar12], (char)this_00->mode == 0x2d)) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        lVar5 = strtol((char *)this_00,(char **)0x0,10);
        lVar7 = -lVar5;
        if (0 < lVar5) {
          lVar7 = lVar5;
        }
        this->fb_size = (ui32_t)lVar7;
        if (this->verbose_flag == true) {
          this_00 = _stderr;
          fprintf((FILE *)_stderr,"Frame Buffer size: %u bytes.\n");
        }
        break;
      case 99:
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) || (pcVar10 = argv[iVar12], *pcVar10 == '-')) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        this->mode = MMT_CREATE;
        this->out_file = pcVar10;
        break;
      case 100:
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) ||
           (this_00 = (CommandOptions *)argv[iVar12], (char)this_00->mode == 0x2d)) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        this->duration_flag = true;
        lVar5 = strtol((char *)this_00,(char **)0x0,10);
        lVar7 = -lVar5;
        if (0 < lVar5) {
          lVar7 = lVar5;
        }
        this->duration = (ui32_t)lVar7;
        break;
      case 0x65:
        this->encrypt_header_flag = true;
        break;
      case 0x66:
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) ||
           (this_00 = (CommandOptions *)argv[iVar12], (char)this_00->mode == 0x2d)) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        lVar5 = strtol((char *)this_00,(char **)0x0,10);
        lVar7 = -lVar5;
        if (0 < lVar5) {
          lVar7 = lVar5;
        }
        this->start_frame = (ui32_t)lVar7;
        break;
      case 0x67:
        this->mode = MMT_GEN_KEY;
        break;
      case 0x68:
        this->help_flag = true;
        break;
      case 0x69:
        this->mode = MMT_INFO;
        break;
      case 0x6a:
        this->key_id_flag = true;
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) ||
           (this_00 = (CommandOptions *)argv[iVar12], (char)this_00->mode == 0x2d)) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        Kumu::hex2bin((char *)this_00,local_68,0x10,(uint *)local_50);
        uVar8 = (ulong)(uint)local_50._0_4_;
        if (local_50._0_4_ != 0x10) {
          pcVar10 = "Unexpected key ID length: %u, expecting %u characters.\n";
          goto LAB_001135e2;
        }
        break;
      case 0x6b:
        this->key_flag = true;
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) ||
           (this_00 = (CommandOptions *)argv[iVar12], (char)this_00->mode == 0x2d)) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        Kumu::hex2bin((char *)this_00,local_60,0x10,(uint *)local_50);
        uVar8 = (ulong)(uint)local_50._0_4_;
        if (local_50._0_4_ != 0x10) {
          pcVar10 = "Unexpected key length: %u, expecting %u characters.\n";
          goto LAB_001135e2;
        }
        break;
      case 0x6c:
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) || (*argv[iVar12] == '-')) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_50,argv[iVar12],&local_71);
        CVar4 = decode_channel_fmt((string *)local_50);
        this->channel_fmt = CVar4;
        this_00 = (CommandOptions *)CONCAT44(local_50._4_4_,local_50._0_4_);
        if (this_00 != (CommandOptions *)(local_50 + 0x10)) {
          operator_delete(this_00,local_50._16_8_ + 1);
        }
        break;
      case 0x6d:
        this->read_hmac = true;
        break;
      case 0x6e:
        this->showindex_flag = true;
        break;
      case 0x70:
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) ||
           (this_00 = (CommandOptions *)argv[iVar12], (char)this_00->mode == 0x2d)) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        lVar5 = strtol((char *)this_00,(char **)0x0,10);
        lVar7 = -lVar5;
        if (0 < lVar5) {
          lVar7 = lVar5;
        }
        this->picture_rate = (ui32_t)lVar7;
        break;
      case 0x73:
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) ||
           (this_00 = (CommandOptions *)argv[iVar12], (char)this_00->mode == 0x2d)) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        lVar5 = strtol((char *)this_00,(char **)0x0,10);
        lVar7 = -lVar5;
        if (0 < lVar5) {
          lVar7 = lVar5;
        }
        *local_58 = (ui32_t)lVar7;
        break;
      case 0x74:
        this->mode = MMT_DIGEST;
        break;
      case 0x75:
        this->mode = MMT_GEN_ID;
        break;
      case 0x76:
        this->verbose_flag = true;
        break;
      case 0x77:
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) ||
           (this_00 = (CommandOptions *)argv[iVar12], (char)this_00->mode == 0x2d)) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        lVar5 = strtol((char *)this_00,(char **)0x0,10);
        lVar7 = -lVar5;
        if (0 < lVar5) {
          lVar7 = lVar5;
        }
        this->number_width = (ui32_t)lVar7;
        break;
      case 0x78:
        iVar12 = iVar12 + 1;
        if ((argc <= iVar12) || (pcVar10 = argv[iVar12], *pcVar10 == '-')) {
          CommandOptions(this_00);
          goto LAB_001134e0;
        }
        this->mode = MMT_EXTRACT;
        this->file_root = pcVar10;
        break;
      case 0x7a:
        this->j2c_pedantic = true;
      }
LAB_00112f91:
      iVar12 = iVar12 + 1;
      bVar9 = iVar12 < argc;
    } while (iVar12 < argc);
  }
LAB_001134e8:
  if (this->help_flag != false) {
    return;
  }
  if (this->version_flag == false) {
    MVar2 = this->mode;
    if (MVar2 < MMT_UL_LIST) {
      if (((0xceU >> (MVar2 & 0x1f) & 1) != 0) && (this->file_count == 0)) {
        CommandOptions(this_00);
        return;
      }
      if (MVar2 == MMT_NONE) {
        CommandOptions(this_00);
        return;
      }
    }
    this->error_flag = false;
    return;
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    mode(MMT_NONE), error_flag(true), key_flag(false), key_id_flag(false), asset_id_flag(false),
    encrypt_header_flag(true), write_hmac(true), read_hmac(false), split_wav(false), mono_wav(false),
    verbose_flag(false), fb_dump_size(0), showindex_flag(false), showheader_flag(false),
    no_write_flag(false), version_flag(false), help_flag(false), stereo_image_flag(false),
    number_width(6), start_frame(0),
    duration(0xffffffff), duration_flag(false), do_repeat(false), use_smpte_labels(false), j2c_pedantic(true),
    picture_rate(24), fb_size(FRAME_BUFFER_SIZE), file_count(0), file_root(0), out_file(0),
    channel_fmt(PCM::CF_NONE)
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);

    for ( int i = 1; i < argc; i++ )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }
         
	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '1': mono_wav = true; break;
	      case '2': split_wav = true; break;
	      case '3': stereo_image_flag = true; break;

	      case 'a':
		asset_id_flag = true;
		TEST_EXTRA_ARG(i, 'a');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], asset_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected asset ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));

		if ( verbose_flag )
		  fprintf(stderr, "Frame Buffer size: %u bytes.\n", fb_size);

		break;

	      case 'c':
		TEST_EXTRA_ARG(i, 'c');
		mode = MMT_CREATE;
		out_file = argv[i];
		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration_flag = true;
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'E': encrypt_header_flag = false; break;
	      case 'e': encrypt_header_flag = true; break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'G': mode = MMT_GOP_START; break;
	      case 'g': mode = MMT_GEN_KEY; break;
	      case 'H': showheader_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'i': mode = MMT_INFO;	break;

	      case 'j': key_id_flag = true;
		TEST_EXTRA_ARG(i, 'j');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_id_value, UUIDlen, &length);

		  if ( length != UUIDlen )
		    {
		      fprintf(stderr, "Unexpected key ID length: %u, expecting %u characters.\n", length, UUIDlen);
		      return;
		    }
		}
		break;

	      case 'k': key_flag = true;
		TEST_EXTRA_ARG(i, 'k');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_value, KeyLen, &length);

		  if ( length != KeyLen )
		    {
		      fprintf(stderr, "Unexpected key length: %u, expecting %u characters.\n", length, KeyLen);
		      return;
		    }
		}
		break;

	      case 'l':
		TEST_EXTRA_ARG(i, 'l');
		channel_fmt = decode_channel_fmt(argv[i]);
		break;

	      case 'L': use_smpte_labels = true; break;
	      case 'M': write_hmac = false; break;
	      case 'm': read_hmac = true; break;
	      case 'n': showindex_flag = true; break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'R': do_repeat = true; break;
	      case 'S': split_wav = true; break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		fb_dump_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 't': mode = MMT_DIGEST; break;
	      case 'U':	mode = MMT_UL_LIST; break;
	      case 'u':	mode = MMT_GEN_ID; break;
	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'W': no_write_flag = true; break;

	      case 'w':
		TEST_EXTRA_ARG(i, 'w');
		number_width = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'x':
		TEST_EXTRA_ARG(i, 'x');
		mode = MMT_EXTRACT;
		file_root = argv[i];
		break;

	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {

	    if ( argv[i][0] != '-' )
	      {
		filenames[file_count++] = argv[i];
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }

	    if ( file_count >= MAX_IN_FILES )
	      {
		fprintf(stderr, "Filename lists exceeds maximum list size: %u\n", MAX_IN_FILES);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;
    
    if ( ( mode == MMT_INFO
	   || mode == MMT_CREATE
	   || mode == MMT_EXTRACT
	   || mode == MMT_GOP_START
	   || mode == MMT_DIGEST ) && file_count == 0 )
      {
	fputs("Option requires at least one filename argument.\n", stderr);
	return;
      }

    if ( mode == MMT_NONE && ! help_flag && ! version_flag )
      {
	fputs("No operation selected (use one of -[gGcitux] or -h for help).\n", stderr);
	return;
      }

    error_flag = false;
  }